

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

float __thiscall
deqp::gles3::Functional::FloatScalar::getValue
          (FloatScalar *this,Functions *gl,ShaderType shaderType)

{
  char cVar1;
  GLenum GVar2;
  TestError *this_00;
  GLenum GVar3;
  GLint precision;
  GLint range [2];
  GLint local_1c;
  int local_18 [2];
  
  if (this->m_isConstant == true) {
    return (this->m_value).constant;
  }
  switch((this->m_value).symbol) {
  case SYMBOL_LOWP_UINT_MAX:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df3,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) {
LAB_01102784:
      return (float)~(-1L << (cVar1 + 1U & 0x3f));
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  case SYMBOL_MEDIUMP_UINT_MAX:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df4,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) goto LAB_01102784;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df3,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) {
LAB_011026f4:
      return 1.0 / (float)~(-1L << (cVar1 + 1U & 0x3f));
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df4,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) goto LAB_011026f4;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df3,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) {
LAB_01102808:
      return -4.2949673e+09 / (float)~(-1L << (cVar1 + 1U & 0x3f)) + 1.0;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:
    GVar2 = 0x8b30;
    if (shaderType != SHADERTYPE_FRAGMENT) {
      GVar2 = 0;
    }
    GVar3 = 0x8b31;
    if (shaderType != SHADERTYPE_VERTEX) {
      GVar3 = GVar2;
    }
    local_18[0] = -1;
    local_18[1] = -1;
    local_1c = -1;
    (*gl->getShaderPrecisionFormat)(GVar3,0x8df4,local_18,&local_1c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetShaderPrecisionFormat failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
                    ,0x15d);
    cVar1 = (char)local_18[0];
    if (local_18[0] - 8U < 0x18) goto LAB_01102808;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"de::inBounds(range[0], 8, 32)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderOperatorTests.cpp"
               ,0x15f);
    break;
  default:
    return 0.0;
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

float getValue (const glw::Functions& gl, ShaderType shaderType) const
	{
		if (m_isConstant)
			return m_value.constant;
		else
		{
			switch (m_value.symbol)
			{
				case SYMBOL_LOWP_UINT_MAX:								return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX:							return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:					return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:				return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:		return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:	return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				default:
					DE_ASSERT(false);
					return 0.0f;
			}
		}
	}